

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

void __thiscall Json::FastWriter::~FastWriter(FastWriter *this)

{
  FastWriter *in_RDI;
  
  ~FastWriter(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~FastWriter() {}